

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O2

void restore_oracles(memfile *mf)

{
  uint uVar1;
  int32_t iVar2;
  ulong uVar3;
  
  uVar1 = mread32(mf);
  oracle_cnt = uVar1;
  if (uVar1 != 0) {
    oracle_loc = (int *)malloc((ulong)uVar1 << 2);
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      iVar2 = mread32(mf);
      oracle_loc[uVar3] = iVar2;
      uVar1 = oracle_cnt;
    }
    oracle_flg = 1;
  }
  return;
}

Assistant:

void restore_oracles(struct memfile *mf)
{
	int i;
	oracle_cnt = mread32(mf);
	if (oracle_cnt) {
	    oracle_loc = malloc(oracle_cnt * sizeof(int));
	    for (i = 0; i < oracle_cnt; i++)
		oracle_loc[i] = mread32(mf);
	    oracle_flg = 1;	/* no need to call init_oracles() */
	}
}